

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

size_t * __thiscall
andres::
BinaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Minus<int,_int,_int>_>
::shapeEnd(BinaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Minus<int,_int,_int>_>
           *this)

{
  size_t sVar1;
  size_t sVar2;
  size_t *local_28;
  BinaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Minus<int,_int,_int>_>
  *this_local;
  
  sVar1 = View<int,_true,_std::allocator<unsigned_long>_>::dimension(this->e1_);
  sVar2 = View<int,_true,_std::allocator<unsigned_long>_>::dimension(this->e2_);
  if (sVar1 < sVar2) {
    local_28 = View<int,_true,_std::allocator<unsigned_long>_>::shapeEnd(this->e2_);
  }
  else {
    local_28 = View<int,_true,_std::allocator<unsigned_long>_>::shapeEnd(this->e1_);
  }
  return local_28;
}

Assistant:

const std::size_t* shapeEnd() const 
        { return e1_.dimension() < e2_.dimension() ? e2_.shapeEnd() : e1_.shapeEnd(); }